

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_bspline_to_bezier(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  long *plVar2;
  long lVar3;
  HairSetNode *this_00;
  ulong uVar4;
  Ref<embree::SceneGraph::Node> local_60;
  Ref<embree::SceneGraph::Node> local_58;
  Ref<embree::SceneGraph::Node> local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar2 == (long *)0x0) {
        plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar2 == (long *)0x0) {
          this_00 = (HairSetNode *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
          if (this_00 != (HairSetNode *)0x0) {
            (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
            HairSetNode::convert_bspline_to_bezier(this_00);
            (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x10))(plVar2);
          lVar3 = plVar2[0xd];
          if (plVar2[0xe] != lVar3) {
            uVar4 = 0;
            do {
              local_60.ptr = *(Node **)(lVar3 + uVar4 * 8);
              if (local_60.ptr != (Node *)0x0) {
                (*((local_60.ptr)->super_RefCount)._vptr_RefCount[2])();
              }
              convert_bspline_to_bezier((SceneGraph *)&local_48,&local_60);
              if (local_48 != (long *)0x0) {
                (**(code **)(*local_48 + 0x18))();
              }
              if (local_60.ptr != (Node *)0x0) {
                (*((local_60.ptr)->super_RefCount)._vptr_RefCount[3])();
              }
              uVar4 = uVar4 + 1;
              lVar3 = plVar2[0xd];
            } while (uVar4 < (ulong)(plVar2[0xe] - lVar3 >> 3));
          }
          (**(code **)(*plVar2 + 0x18))(plVar2);
        }
      }
      else {
        (**(code **)(*plVar2 + 0x10))(plVar2);
        local_58.ptr = (Node *)plVar2[0x10];
        if (local_58.ptr != (Node *)0x0) {
          (*((local_58.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_bspline_to_bezier((SceneGraph *)&local_40,&local_58);
        if (local_40 != (long *)0x0) {
          (**(code **)(*local_40 + 0x18))();
        }
        if (local_58.ptr != (Node *)0x0) {
          (*((local_58.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar2 + 0x18))(plVar2);
      }
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      local_50.ptr = (Node *)plVar2[0x13];
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_bspline_to_bezier((SceneGraph *)&local_38,&local_50);
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 0x18))();
      }
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
  }
  *(Node **)this = node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bspline_to_bezier(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        convert_bspline_to_bezier(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      hmesh->convert_bspline_to_bezier();
    }
    return node;
  }